

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# survey_test.c
# Opt level: O0

void test_surv_ctx_recv_close_socket(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  nng_err result__8;
  nng_err result__7;
  nng_err result__6;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  nng_msg *m;
  nng_aio *aio;
  nng_socket local_10;
  nng_ctx ctx;
  nng_socket resp;
  nng_socket surv;
  
  nVar1 = nng_surveyor0_open((nng_socket *)&ctx);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,0x1f2,"%s: expected success, got %s (%d)","nng_surveyor0_open(&surv)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_respondent0_open(&local_10);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,499,"%s: expected success, got %s (%d)","nng_respondent0_open(&resp)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_ctx_open((nng_ctx *)((long)&aio + 4),(nng_socket)ctx.id);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,500,"%s: expected success, got %s (%d)","nng_ctx_open(&ctx, surv)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_aio_alloc((nng_aio **)&m,(_func_void_void_ptr *)0x0,(void *)0x0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,0x1f5,"%s: expected success, got %s (%d)",
                         "nng_aio_alloc(&aio, NULL, NULL)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nuts_marry((nng_socket)ctx.id,local_10);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,0x1f6,"%s: expected success, got %s (%d)","nuts_marry(surv, resp)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_msg_alloc((nng_msg **)&result__1,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,0x1f7,"%s: expected success, got %s (%d)","nng_msg_alloc(&m, 0)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nng_aio_set_msg((nng_aio *)m,_result__1);
  nng_ctx_send(aio._4_4_,(nng_aio *)m);
  nng_aio_wait((nng_aio *)m);
  nVar1 = nng_aio_result((nng_aio *)m);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,0x1fb,"%s: expected success, got %s (%d)","nng_aio_result(aio)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nng_ctx_recv(aio._4_4_,(nng_aio *)m);
  nng_socket_close((nng_socket)ctx.id);
  nng_aio_wait((nng_aio *)m);
  nVar1 = nng_aio_result((nng_aio *)m);
  pcVar3 = nng_strerror(NNG_ECLOSED);
  acutest_check_((uint)(nVar1 == NNG_ECLOSED),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                 ,0x201,"%s fails with %s","nng_aio_result(aio)",pcVar3);
  pcVar3 = nng_strerror(NNG_ECLOSED);
  pcVar4 = nng_strerror(nVar1);
  acutest_message_("%s: expected %s (%d), got %s (%d)","nng_aio_result(aio)",pcVar3,7,pcVar4,
                   (ulong)nVar1);
  nng_aio_free((nng_aio *)m);
  nVar1 = nng_socket_close(local_10);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/survey0/survey_test.c"
                         ,0x203,"%s: expected success, got %s (%d)","nng_socket_close(resp)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  return;
}

Assistant:

static void
test_surv_ctx_recv_close_socket(void)
{
	nng_socket surv;
	nng_socket resp;
	nng_ctx    ctx;
	nng_aio   *aio;
	nng_msg   *m;

	NUTS_PASS(nng_surveyor0_open(&surv));
	NUTS_PASS(nng_respondent0_open(&resp));
	NUTS_PASS(nng_ctx_open(&ctx, surv));
	NUTS_PASS(nng_aio_alloc(&aio, NULL, NULL));
	NUTS_MARRY(surv, resp);
	NUTS_PASS(nng_msg_alloc(&m, 0));
	nng_aio_set_msg(aio, m);
	nng_ctx_send(ctx, aio);
	nng_aio_wait(aio);
	NUTS_PASS(nng_aio_result(aio));

	nng_ctx_recv(ctx, aio);
	nng_socket_close(surv);

	nng_aio_wait(aio);
	NUTS_FAIL(nng_aio_result(aio), NNG_ECLOSED);
	nng_aio_free(aio);
	NUTS_CLOSE(resp);
}